

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QStackedLayout::takeAt(QStackedLayout *this,int index)

{
  long lVar1;
  int iVar2;
  QLayoutItem *pQVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong i;
  
  if (-1 < index) {
    lVar1 = *(long *)&(this->super_QLayout).field_0x8;
    i = (ulong)(uint)index;
    if (i < *(ulong *)(lVar1 + 0xc0)) {
      pQVar3 = QList<QLayoutItem_*>::takeAt((QList<QLayoutItem_*> *)(lVar1 + 0xb0),i);
      iVar2 = *(int *)(lVar1 + 200);
      if (iVar2 == index) {
        *(undefined4 *)(lVar1 + 200) = 0xffffffff;
        if (*(ulong *)(lVar1 + 0xc0) == 0) {
          currentChanged(this,-1);
        }
        else {
          setCurrentIndex(this,index - (uint)(*(ulong *)(lVar1 + 0xc0) == i));
        }
      }
      else if (index < iVar2) {
        *(int *)(lVar1 + 200) = iVar2 + -1;
      }
      widgetRemoved(this,index);
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        return pQVar3;
      }
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      if ((*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) + 0x30) & 4) != 0) {
        return pQVar3;
      }
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      QWidget::hide((QWidget *)CONCAT44(extraout_var_01,iVar2));
      return pQVar3;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QStackedLayout::takeAt(int index)
{
    Q_D(QStackedLayout);
    if (index <0 || index >= d->list.size())
        return nullptr;
    QLayoutItem *item = d->list.takeAt(index);
    if (index == d->index) {
        d->index = -1;
        if ( d->list.size() > 0 ) {
            int newIndex = (index == d->list.size()) ? index-1 : index;
            setCurrentIndex(newIndex);
        } else {
            emit currentChanged(-1);
        }
    } else if (index < d->index) {
        --d->index;
    }
    emit widgetRemoved(index);
    if (item->widget() && !qt_wasDeleted(item->widget()))
        item->widget()->hide();
    return item;
}